

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0003(TypeCanonicalizerAndResolverTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  allocator<char> local_34a;
  allocator<char> local_349;
  string local_348;
  string local_328;
  Expectation local_308;
  Expectation local_250;
  Decl local_198;
  Decl local_d0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"\ntypedef double const x ;\nx const y ;\n",&local_349);
  Expectation::Expectation(&local_308);
  Decl::Decl(&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"y",&local_34a);
  pDVar1 = Decl::Object(&local_198,&local_348,VariableDeclaration,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Double,Const);
  Decl::Decl(&local_d0,pDVar1);
  pEVar2 = Expectation::declaration(&local_308,&local_d0);
  Expectation::Expectation(&local_250,pEVar2);
  canonicalizerAndResolveTypes(this,&local_328,&local_250);
  Expectation::~Expectation(&local_250);
  Decl::~Decl(&local_d0);
  std::__cxx11::string::~string((string *)&local_348);
  Decl::~Decl(&local_198);
  Expectation::~Expectation(&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0003()
{
    auto s = R"(
typedef double const x ;
x const y ;
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .declaration(Decl()
                         .Object("y", SymbolKind::VariableDeclaration)
                         .ty_.Basic(BasicTypeKind::Double, CVR::Const)));
}